

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O1

void __thiscall
flatbuffers::ToStringVisitor::Element
          (ToStringVisitor *this,size_t i,ElementaryType param_2,TypeTable *param_3,uint8_t *param_4
          )

{
  string *psVar1;
  
  if (i == 0) {
    return;
  }
  psVar1 = &this->s;
  std::__cxx11::string::append((char *)psVar1);
  if (this->vector_delimited == true) {
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)(this->d)._M_dataplus._M_p);
    append_indent(this);
    return;
  }
  std::__cxx11::string::append((char *)psVar1);
  return;
}

Assistant:

void Element(size_t i, ElementaryType /*type*/,
               const TypeTable * /*type_table*/, const uint8_t * /*val*/) {
    if (i) {
      s += ",";
      if (vector_delimited) {
        s += d;
        append_indent();
      } else {
        s += " ";
      }
    }
  }